

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_b38497::Target::Dump(Value *__return_storage_ptr__,Target *this)

{
  bool bVar1;
  string *value;
  Value *pVVar2;
  char *value_00;
  Value local_410;
  Value local_3e8;
  undefined1 local_3c0 [8];
  Value compileGroups;
  undefined1 local_370 [8];
  Value sourceGroups;
  undefined1 local_320 [8];
  Value folder;
  Value local_2d0;
  undefined1 local_2a8 [8];
  Value dependencies;
  string local_258;
  Value local_238;
  Value local_210;
  string local_1e8;
  Value local_1c8;
  Value local_1a0;
  undefined1 local_178 [8];
  Value artifacts;
  undefined1 local_128 [56];
  Value local_f0;
  string local_c8;
  Value local_a8;
  Value local_80;
  Value local_58;
  TargetType local_20;
  byte local_19;
  TargetType type;
  Target *this_local;
  Value *target;
  
  local_19 = 0;
  _type = this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  local_20 = cmGeneratorTarget::GetType(this->GT);
  value = cmGeneratorTarget::GetName_abi_cxx11_(this->GT);
  Json::Value::Value(&local_58,value);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar2,&local_58);
  Json::Value::~Value(&local_58);
  value_00 = cmState::GetTargetTypeName(local_20);
  Json::Value::Value(&local_80,value_00);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"type");
  Json::Value::operator=(pVVar2,&local_80);
  Json::Value::~Value(&local_80);
  TargetId(&local_c8,this->GT,&this->TopBuild);
  Json::Value::Value(&local_a8,&local_c8);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"id");
  Json::Value::operator=(pVVar2,&local_a8);
  Json::Value::~Value(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  DumpPaths(&local_f0,this);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar2,&local_f0);
  Json::Value::~Value(&local_f0);
  bVar1 = cmTarget::GetIsGeneratorProvided(this->GT->Target);
  if (bVar1) {
    Json::Value::Value((Value *)(local_128 + 0x10),true);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"isGeneratorProvided");
    Json::Value::operator=(pVVar2,(Value *)(local_128 + 0x10));
    Json::Value::~Value((Value *)(local_128 + 0x10));
  }
  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_128);
  AddBacktrace(this,__return_storage_ptr__,(cmListFileBacktrace *)local_128);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_128);
  bVar1 = cmTarget::GetHaveInstallRule(this->GT->Target);
  if (bVar1) {
    DumpInstall((Value *)&artifacts.limit_,this);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"install");
    Json::Value::operator=(pVVar2,(Value *)&artifacts.limit_);
    Json::Value::~Value((Value *)&artifacts.limit_);
  }
  bVar1 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar1) {
    DumpArtifacts((Value *)local_178,this);
    bVar1 = Json::Value::empty((Value *)local_178);
    if (!bVar1) {
      Json::Value::Value(&local_1a0,(Value *)local_178);
      pVVar2 = Json::Value::operator[](__return_storage_ptr__,"artifacts");
      Json::Value::operator=(pVVar2,&local_1a0);
      Json::Value::~Value(&local_1a0);
    }
    Json::Value::~Value((Value *)local_178);
  }
  if (((local_20 == EXECUTABLE) || (local_20 == SHARED_LIBRARY)) || (local_20 == MODULE_LIBRARY)) {
    cmGeneratorTarget::GetFullName(&local_1e8,this->GT,this->Config,RuntimeBinaryArtifact);
    Json::Value::Value(&local_1c8,&local_1e8);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar2,&local_1c8);
    Json::Value::~Value(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    DumpLink(&local_210,this);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"link");
    Json::Value::operator=(pVVar2,&local_210);
    Json::Value::~Value(&local_210);
  }
  else if (local_20 == STATIC_LIBRARY) {
    cmGeneratorTarget::GetFullName(&local_258,this->GT,this->Config,RuntimeBinaryArtifact);
    Json::Value::Value(&local_238,&local_258);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar2,&local_238);
    Json::Value::~Value(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    DumpArchive((Value *)&dependencies.limit_,this);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"archive");
    Json::Value::operator=(pVVar2,(Value *)&dependencies.limit_);
    Json::Value::~Value((Value *)&dependencies.limit_);
  }
  DumpDependencies((Value *)local_2a8,this);
  bVar1 = Json::Value::empty((Value *)local_2a8);
  if (!bVar1) {
    Json::Value::Value(&local_2d0,(Value *)local_2a8);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"dependencies");
    Json::Value::operator=(pVVar2,&local_2d0);
    Json::Value::~Value(&local_2d0);
  }
  ProcessLanguages(this);
  DumpSources((Value *)&folder.limit_,this);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"sources");
  Json::Value::operator=(pVVar2,(Value *)&folder.limit_);
  Json::Value::~Value((Value *)&folder.limit_);
  DumpFolder((Value *)local_320,this);
  bVar1 = Json::Value::isNull((Value *)local_320);
  if (!bVar1) {
    Json::Value::Value((Value *)&sourceGroups.limit_,(Value *)local_320);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"folder");
    Json::Value::operator=(pVVar2,(Value *)&sourceGroups.limit_);
    Json::Value::~Value((Value *)&sourceGroups.limit_);
  }
  DumpSourceGroups((Value *)local_370,this);
  bVar1 = Json::Value::empty((Value *)local_370);
  if (!bVar1) {
    Json::Value::Value((Value *)&compileGroups.limit_,(Value *)local_370);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"sourceGroups");
    Json::Value::operator=(pVVar2,(Value *)&compileGroups.limit_);
    Json::Value::~Value((Value *)&compileGroups.limit_);
  }
  DumpCompileGroups((Value *)local_3c0,this);
  bVar1 = Json::Value::empty((Value *)local_3c0);
  if (!bVar1) {
    Json::Value::Value(&local_3e8,(Value *)local_3c0);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"compileGroups");
    Json::Value::operator=(pVVar2,&local_3e8);
    Json::Value::~Value(&local_3e8);
  }
  Json::Value::~Value((Value *)local_3c0);
  Json::Value::~Value((Value *)local_370);
  Json::Value::~Value((Value *)local_320);
  BacktraceData::Dump(&local_410,&this->Backtraces);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"backtraceGraph");
  Json::Value::operator=(pVVar2,&local_410);
  Json::Value::~Value(&local_410);
  local_19 = 1;
  Json::Value::~Value((Value *)local_2a8);
  if ((local_19 & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::Dump()
{
  Json::Value target = Json::objectValue;

  cmStateEnums::TargetType const type = this->GT->GetType();

  target["name"] = this->GT->GetName();
  target["type"] = cmState::GetTargetTypeName(type);
  target["id"] = TargetId(this->GT, this->TopBuild);
  target["paths"] = this->DumpPaths();
  if (this->GT->Target->GetIsGeneratorProvided()) {
    target["isGeneratorProvided"] = true;
  }

  this->AddBacktrace(target, this->GT->GetBacktrace());

  if (this->GT->Target->GetHaveInstallRule()) {
    target["install"] = this->DumpInstall();
  }

  if (this->GT->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = this->DumpArtifacts();
    if (!artifacts.empty()) {
      target["artifacts"] = std::move(artifacts);
    }
  }

  if (type == cmStateEnums::EXECUTABLE ||
      type == cmStateEnums::SHARED_LIBRARY ||
      type == cmStateEnums::MODULE_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["link"] = this->DumpLink();
  } else if (type == cmStateEnums::STATIC_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["archive"] = this->DumpArchive();
  }

  Json::Value dependencies = this->DumpDependencies();
  if (!dependencies.empty()) {
    target["dependencies"] = dependencies;
  }

  {
    this->ProcessLanguages();

    target["sources"] = this->DumpSources();

    Json::Value folder = this->DumpFolder();
    if (!folder.isNull()) {
      target["folder"] = std::move(folder);
    }

    Json::Value sourceGroups = this->DumpSourceGroups();
    if (!sourceGroups.empty()) {
      target["sourceGroups"] = std::move(sourceGroups);
    }

    Json::Value compileGroups = this->DumpCompileGroups();
    if (!compileGroups.empty()) {
      target["compileGroups"] = std::move(compileGroups);
    }
  }

  target["backtraceGraph"] = this->Backtraces.Dump();

  return target;
}